

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall
FlowGraph::InsertInlineeOnFLowEdge
          (FlowGraph *this,BranchInstr *instrBr,Instr *inlineeEndInstr,Instr *instrBytecode,
          Func *origBrFunc,uint32 origByteCodeOffset,bool origBranchSrcOpndIsJITOpt,
          uint32 origBranchSrcSymId)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  BranchInstr *pBVar5;
  LabelInstr *pLVar6;
  BranchInstr *this_00;
  Instr *this_01;
  Opnd *pOVar7;
  ByteCodeUsesInstr *this_02;
  undefined4 *puVar8;
  Func *this_03;
  uint newBrFnNumber;
  ByteCodeUsesInstr *useOrigBranchSrcInstr;
  Instr *newInlineeEnd;
  LabelInstr *newLabel;
  BranchInstr *newBr;
  bool origBranchSrcOpndIsJITOpt_local;
  uint32 origByteCodeOffset_local;
  Func *origBrFunc_local;
  Instr *instrBytecode_local;
  Instr *inlineeEndInstr_local;
  BranchInstr *instrBr_local;
  FlowGraph *this_local;
  
  pBVar5 = IR::Instr::AsBranchInstr(&instrBr->super_Instr);
  IR::BranchInstr::Invert(pBVar5);
  pBVar5 = IR::Instr::AsBranchInstr(&instrBr->super_Instr);
  pLVar6 = IR::BranchInstr::GetTarget(pBVar5);
  pBVar5 = IR::BranchInstr::New(Br,pLVar6,origBrFunc);
  IR::Instr::SetByteCodeOffset(&pBVar5->super_Instr,origByteCodeOffset);
  IR::Instr::InsertAfter(&instrBr->super_Instr,&pBVar5->super_Instr);
  pLVar6 = IR::LabelInstr::New(Label,(instrBr->super_Instr).m_func,false);
  IR::Instr::SetByteCodeOffset(&pLVar6->super_Instr,instrBytecode);
  IR::Instr::InsertAfter(&pBVar5->super_Instr,&pLVar6->super_Instr);
  this_00 = IR::Instr::AsBranchInstr(&instrBr->super_Instr);
  IR::BranchInstr::SetTarget(this_00,pLVar6);
  this_01 = IR::Instr::New(InlineeEnd,inlineeEndInstr->m_func);
  pOVar7 = IR::Instr::GetSrc1(inlineeEndInstr);
  IR::Instr::SetSrc1(this_01,pOVar7);
  pOVar7 = IR::Instr::GetSrc2(inlineeEndInstr);
  IR::Instr::SetSrc2(this_01,pOVar7);
  IR::Instr::SetByteCodeOffset(this_01,instrBytecode);
  IR::Instr::SetIsCloned(this_01,true);
  IR::Instr::InsertBefore(&pBVar5->super_Instr,this_01);
  this_02 = IR::ByteCodeUsesInstr::New(origBrFunc,origByteCodeOffset);
  IR::ByteCodeUsesInstr::SetRemovedOpndSymbol(this_02,origBranchSrcOpndIsJITOpt,origBranchSrcSymId);
  IR::Instr::InsertBefore(&pBVar5->super_Instr,&this_02->super_Instr);
  uVar3 = Func::GetFunctionNumber((pBVar5->super_Instr).m_func);
  uVar4 = Func::GetFunctionNumber(origBrFunc);
  if (uVar3 != uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xc2a,"(newBrFnNumber == origBrFunc->GetFunctionNumber())",
                       "newBrFnNumber == origBrFunc->GetFunctionNumber()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  uVar4 = Func::GetFunctionNumber(inlineeEndInstr->m_func);
  if (uVar3 == uVar4) {
    this_03 = Func::GetParentFunc(inlineeEndInstr->m_func);
    uVar4 = Func::GetFunctionNumber(this_03);
    if (uVar3 != uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xc2f,
                         "(newBrFnNumber != inlineeEndInstr->m_func->GetFunctionNumber() || newBrFnNumber == inlineeEndInstr->m_func->GetParentFunc()->GetFunctionNumber())"
                         ,
                         "newBrFnNumber != inlineeEndInstr->m_func->GetFunctionNumber() || newBrFnNumber == inlineeEndInstr->m_func->GetParentFunc()->GetFunctionNumber()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  return;
}

Assistant:

void
FlowGraph::InsertInlineeOnFLowEdge(IR::BranchInstr *instrBr, IR::Instr *inlineeEndInstr, IR::Instr *instrBytecode, Func* origBrFunc, uint32 origByteCodeOffset, bool origBranchSrcOpndIsJITOpt, uint32 origBranchSrcSymId)
{
    // Helper for PeepsCm code.
    //
    // We've skipped some InlineeEnd.  Globopt expects to see these
    // on all flow paths out of the inlinee.  Insert an InlineeEnd
    // on the new path:
    //      BrEq $L1, a, b
    // Becomes:
    //      BrNeq $L2, a, b
    //      InlineeEnd
    //      Br $L1
    //  L2:

    instrBr->AsBranchInstr()->Invert();

    IR::BranchInstr *newBr = IR::BranchInstr::New(Js::OpCode::Br, instrBr->AsBranchInstr()->GetTarget(), origBrFunc);
    newBr->SetByteCodeOffset(origByteCodeOffset);
    instrBr->InsertAfter(newBr);

    IR::LabelInstr *newLabel = IR::LabelInstr::New(Js::OpCode::Label, instrBr->m_func);
    newLabel->SetByteCodeOffset(instrBytecode);
    newBr->InsertAfter(newLabel);
    instrBr->AsBranchInstr()->SetTarget(newLabel);

    IR::Instr *newInlineeEnd = IR::Instr::New(Js::OpCode::InlineeEnd, inlineeEndInstr->m_func);
    newInlineeEnd->SetSrc1(inlineeEndInstr->GetSrc1());
    newInlineeEnd->SetSrc2(inlineeEndInstr->GetSrc2());
    newInlineeEnd->SetByteCodeOffset(instrBytecode);
    newInlineeEnd->SetIsCloned(true);  // Mark it as cloned - this is used later by the inlinee args optimization
    newBr->InsertBefore(newInlineeEnd);

    IR::ByteCodeUsesInstr * useOrigBranchSrcInstr = IR::ByteCodeUsesInstr::New(origBrFunc, origByteCodeOffset);
    useOrigBranchSrcInstr->SetRemovedOpndSymbol(origBranchSrcOpndIsJITOpt, origBranchSrcSymId);
    newBr->InsertBefore(useOrigBranchSrcInstr);

    uint newBrFnNumber = newBr->m_func->GetFunctionNumber();
    Assert(newBrFnNumber == origBrFunc->GetFunctionNumber());

    // The function numbers of the new branch and the inlineeEnd instruction should be different (ensuring that the new branch is not added in the inlinee but in the inliner).
    // Only case when they can be same is recursive calls - inlinee and inliner are the same function
    Assert(newBrFnNumber != inlineeEndInstr->m_func->GetFunctionNumber() ||
        newBrFnNumber == inlineeEndInstr->m_func->GetParentFunc()->GetFunctionNumber());
}